

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

bool duckdb::AccessModeSetting::OnGlobalSet(DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  string local_40;
  
  if (db == (DatabaseInstance *)0x0) {
    return true;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Cannot change access_mode setting while database is running - it must be set when opening or attaching the database"
             ,"");
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool AccessModeSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (db) {
		throw InvalidInputException("Cannot change access_mode setting while database is running - it must be set when "
		                            "opening or attaching the database");
	}
	return true;
}